

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O2

void __thiscall Fl_GTK_File_Chooser::changed_output_type(Fl_GTK_File_Chooser *this,char *filter)

{
  char *pcVar1;
  char *pcVar2;
  gchar *name;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  
  if (((this->super_Fl_FLTK_File_Chooser)._options & 8) != 0) {
    pcVar1 = strchr(filter,0x28);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strchr(filter,0x7b);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = filter + 1;
        pcVar2 = strchr(pcVar1,0x2a);
        if (((pcVar2 == (char *)0x0) && (*filter == '*')) && (*pcVar1 == '.')) {
          name = (*fl_gtk_file_chooser_get_filename)((GtkFileChooser *)this->gtkw_ptr);
          if (name != (gchar *)0x0) {
            pcVar2 = fl_filename_name(name);
            pcVar3 = strrchr(pcVar2,0x2e);
            if (pcVar3 == (char *)0x0) {
              sVar4 = strlen(pcVar2);
              pcVar3 = pcVar2 + sVar4;
            }
            sVar4 = strlen(pcVar2);
            sVar5 = strlen(filter);
            __dest = (char *)operator_new__(sVar4 + sVar5);
            strcpy(__dest,pcVar2);
            strcpy(__dest + ((long)pcVar3 - (long)pcVar2),pcVar1);
            (*fl_gtk_file_chooser_set_current_name)((GtkFileChooser *)this->gtkw_ptr,__dest);
            operator_delete__(__dest);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_GTK_File_Chooser::changed_output_type(const char *filter)
{
  if ( !(options()&Fl_Native_File_Chooser::USE_FILTER_EXT) ) return;
  if (strchr(filter, '(') || strchr(filter, '{') || strchr(filter+1, '*') || strncmp(filter, "*.", 2)) return;
  const char *p = fl_gtk_file_chooser_get_filename((GtkFileChooser*)gtkw_ptr);
  if (!p) return;
  p = fl_filename_name(p);
  const char *q = strrchr(p, '.');
  if (!q) q = p + strlen(p);
  char *r = new char[strlen(p) + strlen(filter)];
  strcpy(r, p);
  strcpy(r + (q - p), filter + 1);
  fl_gtk_file_chooser_set_current_name((GtkFileChooser*)gtkw_ptr, r);
  delete[] r;
}